

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::relative_pose::modules::sixpt_main
               (Matrix<double,_6,_6,_0,_6,_6> *L1,Matrix<double,_6,_6,_0,_6,_6> *L2,
               rotations_t *solutions)

{
  pointer *ppMVar1;
  double *pdVar2;
  iterator __position;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L1vec;
  cayley_t solution;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> Eig;
  Matrix<std::complex<double>,_64,_64,_0,_64,_64> EV;
  Matrix<double,_64,_64,_0,_64,_64> Action;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  vStack_40e20;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  vStack_40e00;
  cayley_t cStack_40de8;
  undefined1 auStack_40dd0 [16];
  double dStack_40dc0;
  double dStack_40db8;
  double dStack_40db0;
  double dStack_40da8;
  double dStack_40da0;
  double dStack_40d98;
  double dStack_40d90;
  undefined1 auStack_40d88 [64];
  double dStack_40d48;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> EStack_40d40;
  EigenvectorsType EStack_18080;
  Matrix<double,_64,_64,_0,_64,_64> local_8080;
  
  lVar9 = 0x20;
  vStack_40e00.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_40e00.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
  vStack_40e00.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
  vStack_40e20.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
  vStack_40e20.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_40e20.
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
  do {
    pdVar2 = (double *)
             ((long)(L1->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                    m_data.array + lVar9 + -0x20);
    dVar3 = *pdVar2;
    dVar4 = pdVar2[1];
    pdVar2 = (double *)
             ((long)(L1->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                    m_data.array + lVar9 + -0x10);
    dVar5 = *pdVar2;
    dVar6 = pdVar2[1];
    pdVar2 = (double *)
             ((long)(L1->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                    m_data.array + lVar9);
    dVar7 = *pdVar2;
    dVar8 = pdVar2[1];
    if (vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,6,1,0,6,1>>
                ((vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                  *)&vStack_40e00,
                 (iterator)
                 vStack_40e00.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (Matrix<double,_6,_1,_0,_6,_1> *)&EStack_40d40);
    }
    else {
      ((vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2] =
           dVar5;
      ((vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3] =
           dVar6;
      ((vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4] =
           dVar7;
      ((vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5] =
           dVar8;
      ((vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0] =
           dVar3;
      ((vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1] =
           dVar4;
      ((vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2] =
           dVar5;
      ((vStack_40e00.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3] =
           dVar6;
      vStack_40e00.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_40e00.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pdVar2 = (double *)
             ((long)(L2->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                    m_data.array + lVar9 + -0x20);
    dVar3 = *pdVar2;
    dVar4 = pdVar2[1];
    pdVar2 = (double *)
             ((long)(L2->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                    m_data.array + lVar9 + -0x10);
    dVar5 = *pdVar2;
    dVar6 = pdVar2[1];
    pdVar2 = (double *)
             ((long)(L2->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>).m_storage.
                    m_data.array + lVar9);
    dVar7 = *pdVar2;
    dVar8 = pdVar2[1];
    if (vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,6,1,0,6,1>>
                ((vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                  *)&vStack_40e20,
                 (iterator)
                 vStack_40e20.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (Matrix<double,_6,_1,_0,_6,_1> *)&EStack_40d40);
    }
    else {
      ((vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2] =
           dVar5;
      ((vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3] =
           dVar6;
      ((vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4] =
           dVar7;
      ((vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5] =
           dVar8;
      ((vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0] =
           dVar3;
      ((vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1] =
           dVar4;
      ((vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2] =
           dVar5;
      ((vStack_40e20.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3] =
           dVar6;
      vStack_40e20.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_40e20.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    lVar9 = lVar9 + 0x30;
  } while (lVar9 != 0x140);
  memset(&local_8080,0,0x8000);
  sixpt::setupAction(&vStack_40e00,&vStack_40e20,&local_8080);
  memset(&EStack_40d40.m_eivalues,0,0x402);
  Eigen::EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>::
  compute<Eigen::Matrix<double,64,64,0,64,64>>
            ((EigenSolver<Eigen::Matrix<double,64,64,0,64,64>> *)&EStack_40d40,
             (EigenBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *)&local_8080,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>::eigenvectors
            (&EStack_18080,&EStack_40d40);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::reserve(solutions,0x40);
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar11 = __divdc3();
      *(undefined8 *)
       ((long)cStack_40de8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + lVar10) = uVar11;
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x18);
    math::cayley2rot(&cStack_40de8);
    _auStack_40dd0 = vpermpd_avx512f(_DAT_002514c0,auStack_40d88);
    dStack_40d90 = dStack_40d48;
    __position._M_current =
         (solutions->
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (solutions->
        super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>>
                ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                  *)solutions,__position,(Matrix<double,_3,_3,_0,_3,_3> *)auStack_40dd0);
    }
    else {
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[8] = dStack_40d48;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[0] = (double)auStack_40dd0._0_8_;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[1] = (double)auStack_40dd0._8_8_;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[2] = dStack_40dc0;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[3] = dStack_40db8;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[4] = dStack_40db0;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[5] = dStack_40da8;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[6] = dStack_40da0;
      ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[7] = dStack_40d98;
      ppMVar1 = &(solutions->
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x40);
  if (vStack_40e20.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)vStack_40e20.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5]);
  }
  if (vStack_40e00.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)vStack_40e00.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5]);
  }
  return;
}

Assistant:

void
opengv::relative_pose::modules::sixpt_main(
  Eigen::Matrix<double,6,6> & L1,
  Eigen::Matrix<double,6,6> & L2,
  rotations_t & solutions)
{
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<double,6,1>, Eigen::aligned_allocator<Eigen::Matrix<double,6,1> > > L1vec;
  std::vector< Eigen::Matrix<double,6,1>, Eigen::aligned_allocator<Eigen::Matrix<double,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<double,64,64> Action = Eigen::Matrix<double,64,64>::Zero();
  sixpt::setupAction( L1vec, L2vec, Action );
  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<double,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<double>,64,64> EV = Eig.eigenvectors();
  
  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    cayley_t solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<double> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real();
    }
    
    solutions.push_back(math::cayley2rot(solution).transpose());
  }
}